

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O0

int main(int argc,char **argv)

{
  PFNGLROTATEFPROC p_Var1;
  int iVar2;
  time_t tVar3;
  GLFWmonitor **ppGVar4;
  GLFWvidmode *pGVar5;
  double dVar6;
  GLFWvidmode *mode;
  GLFWmonitor **monitors;
  GLFWmonitor *pGStack_38;
  int monitorCount;
  GLFWmonitor *monitor;
  int height;
  int width;
  GLFWwindow *window;
  char **ppcStack_18;
  int count;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  while( true ) {
    pGStack_38 = (GLFWmonitor *)0x0;
    if (window._4_4_ % 2 == 0) {
      ppGVar4 = glfwGetMonitors((int *)((long)&monitors + 4));
      iVar2 = rand();
      pGStack_38 = ppGVar4[iVar2 % monitors._4_4_];
    }
    if (pGStack_38 == (GLFWmonitor *)0x0) {
      monitor._4_4_ = 0x280;
      monitor._0_4_ = 0x1e0;
    }
    else {
      pGVar5 = glfwGetVideoMode(pGStack_38);
      monitor._4_4_ = pGVar5->width;
      monitor._0_4_ = pGVar5->height;
    }
    _height = open_window(monitor._4_4_,(int)monitor,pGStack_38);
    if (_height == (GLFWwindow *)0x0) break;
    (*glad_glMatrixMode)(0x1701);
    (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,1.0,-1.0);
    (*glad_glMatrixMode)(0x1700);
    glfwSetTime(0.0);
    while (dVar6 = glfwGetTime(), dVar6 < 5.0) {
      (*glad_glClear)(0x4000);
      (*glad_glPushMatrix)();
      p_Var1 = glad_glRotatef;
      dVar6 = glfwGetTime();
      (*p_Var1)((float)dVar6 * 100.0,0.0,0.0,1.0);
      (*glad_glRectf)(-0.5,-0.5,1.0,1.0);
      (*glad_glPopMatrix)();
      glfwSwapBuffers(_height);
      glfwPollEvents();
      iVar2 = glfwWindowShouldClose(_height);
      if (iVar2 != 0) {
        close_window(_height);
        printf("User closed window\n");
        glfwTerminate();
        exit(0);
      }
    }
    printf("Closing window\n");
    close_window(_height);
    window._4_4_ = window._4_4_ + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;

        if (count % 2 == 0)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        window = open_window(width, height, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}